

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

void * floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in)

{
  oggpack_buffer *b;
  int *piVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined4 *puVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int local_74;
  
  piVar1 = *(int **)((long)in + 0x308);
  lVar10 = *(long *)((long)vb->vd->vi->codec_setup + 0x1428);
  b = &vb->opb;
  lVar6 = oggpack_read(b,1);
  if (lVar6 == 1) {
    puVar7 = (undefined4 *)_vorbis_block_alloc(vb,(long)*(int *)((long)in + 0x2fc) << 2);
    uVar4 = *(int *)((long)in + 0x304) - 1;
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    iVar12 = (uVar2 ^ 0xffffffe0) + 0x21;
    if (uVar4 == 0) {
      iVar12 = 0;
    }
    lVar6 = oggpack_read(b,iVar12);
    *puVar7 = (int)lVar6;
    uVar4 = *(int *)((long)in + 0x304) - 1;
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    iVar12 = (uVar2 ^ 0xffffffe0) + 0x21;
    if (uVar4 == 0) {
      iVar12 = 0;
    }
    lVar6 = oggpack_read(b,iVar12);
    puVar7[1] = (int)lVar6;
    if (0 < *piVar1) {
      local_74 = 2;
      lVar6 = 0;
      do {
        lVar17 = (long)piVar1[lVar6 + 1];
        uVar2 = piVar1[lVar17 + 0x20];
        iVar12 = piVar1[lVar17 + 0x30];
        uVar16 = 0;
        if ((iVar12 == 0) ||
           (uVar16 = vorbis_book_decode((codebook *)((long)piVar1[lVar17 + 0x40] * 0x60 + lVar10),b)
           , (int)uVar16 != -1)) {
          if (0 < (int)uVar2) {
            bVar9 = (byte)iVar12;
            uVar11 = 0;
            do {
              uVar4 = (uint)uVar16;
              uVar16 = (ulong)(uint)((int)uVar4 >> (bVar9 & 0x1f));
              if ((long)piVar1[lVar17 * 8 + (ulong)(uVar4 & ~(-1 << (bVar9 & 0x1f))) + 0x50] < 0) {
                puVar7[(long)local_74 + uVar11] = 0;
LAB_00121c8e:
                iVar12 = 0;
                bVar3 = true;
              }
              else {
                lVar8 = vorbis_book_decode((codebook *)
                                           ((long)piVar1[lVar17 * 8 +
                                                         (ulong)(uVar4 & ~(-1 << (bVar9 & 0x1f))) +
                                                         0x50] * 0x60 + lVar10),b);
                puVar7[(long)local_74 + uVar11] = (int)lVar8;
                if ((int)lVar8 != -1) goto LAB_00121c8e;
                iVar12 = 5;
                bVar3 = false;
              }
              if (!bVar3) goto LAB_00121cc5;
              uVar11 = uVar11 + 1;
            } while (uVar2 != uVar11);
          }
          local_74 = uVar2 + local_74;
          iVar12 = 0;
        }
        else {
          iVar12 = 5;
        }
LAB_00121cc5:
        if (iVar12 != 0) {
          if (iVar12 != 5) {
            return puVar7;
          }
          goto LAB_00121de3;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < *piVar1);
    }
    if (2 < *(int *)((long)in + 0x2fc)) {
      lVar10 = 0;
      do {
        lVar6 = (long)*(int *)((long)in + lVar10 * 4 + 0x200);
        lVar17 = (long)*(int *)((long)in + lVar10 * 4 + 0x104);
        iVar13 = (puVar7[lVar17] & 0x7fff) - (puVar7[lVar6] & 0x7fff);
        iVar12 = -iVar13;
        if (0 < iVar13) {
          iVar12 = iVar13;
        }
        iVar5 = ((piVar1[lVar10 + 0xd3] - piVar1[lVar6 + 0xd1]) * iVar12) /
                (piVar1[lVar17 + 0xd1] - piVar1[lVar6 + 0xd1]);
        iVar12 = -iVar5;
        if (-1 < iVar13) {
          iVar12 = iVar5;
        }
        uVar4 = iVar12 + (puVar7[lVar6] & 0x7fff);
        uVar2 = puVar7[lVar10 + 2];
        if (uVar2 == 0) {
          puVar7[lVar10 + 2] = uVar4 | 0x8000;
        }
        else {
          uVar14 = *(int *)((long)in + 0x304) - uVar4;
          uVar15 = uVar4;
          if ((int)uVar14 < (int)uVar4) {
            uVar15 = uVar14;
          }
          if (SBORROW4(uVar2,uVar15 * 2) == (int)(uVar2 + uVar15 * -2) < 0) {
            if ((int)uVar4 < (int)uVar14) {
              iVar12 = uVar2 - uVar4;
            }
            else {
              iVar12 = ~uVar2 + uVar14;
            }
          }
          else if ((uVar2 & 1) == 0) {
            iVar12 = (int)uVar2 >> 1;
          }
          else {
            iVar12 = -((int)(uVar2 + 1) >> 1);
          }
          puVar7[lVar10 + 2] = iVar12 + uVar4;
          puVar7[*(int *)((long)in + lVar10 * 4 + 0x200)] =
               puVar7[*(int *)((long)in + lVar10 * 4 + 0x200)] & 0x7fff;
          puVar7[*(int *)((long)in + lVar10 * 4 + 0x104)] =
               puVar7[*(int *)((long)in + lVar10 * 4 + 0x104)] & 0x7fff;
        }
        lVar6 = lVar10 + 3;
        lVar10 = lVar10 + 1;
      } while (lVar6 < *(int *)((long)in + 0x2fc));
    }
  }
  else {
LAB_00121de3:
    puVar7 = (undefined4 *)0x0;
  }
  return puVar7;
}

Assistant:

static void *floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in){
  vorbis_look_floor1 *look=(vorbis_look_floor1 *)in;
  vorbis_info_floor1 *info=look->vi;
  codec_setup_info   *ci=(codec_setup_info *)vb->vd->vi->codec_setup;
  
  int i,j,k;
  codebook *books=ci->fullbooks;   
  
  /* unpack wrapped/predicted values from stream */
  if(oggpack_read(&vb->opb,1)==1){
    int *fit_value=(int *)_vorbis_block_alloc(vb,(look->posts)*sizeof(*fit_value));
    
    fit_value[0]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    fit_value[1]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    
    /* partition by partition */
    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int classv=info->partitionclass[i];
      int cdim=info->class_dim[classv];
      int csubbits=info->class_subs[classv];
      int csub=1<<csubbits;
      int cval=0;

      /* decode the partition's first stage cascade value */
      if(csubbits){
	cval=vorbis_book_decode(books+info->class_book[classv],&vb->opb);

	if(cval==-1)goto eop;
      }

      for(k=0;k<cdim;k++){
	int book=info->class_subbook[classv][cval&(csub-1)];
	cval>>=csubbits;
	if(book>=0){
	  if((fit_value[j+k]=vorbis_book_decode(books+book,&vb->opb))==-1)
	    goto eop;
	}else{
	  fit_value[j+k]=0;
	}
      }
      j+=cdim;
    }

    /* unwrap positive values and reconsitute via linear interpolation */
    for(i=2;i<look->posts;i++){
      int predicted=render_point(info->postlist[look->loneighbor[i-2]],
				 info->postlist[look->hineighbor[i-2]],
				 fit_value[look->loneighbor[i-2]],
				 fit_value[look->hineighbor[i-2]],
				 info->postlist[i]);
      int hiroom=look->quant_q-predicted;
      int loroom=predicted;
      int room=(hiroom<loroom?hiroom:loroom)<<1;
      int val=fit_value[i];

      if(val){
	if(val>=room){
	  if(hiroom>loroom){
	    val = val-loroom;
	  }else{
	  val = -1-(val-hiroom);
	  }
	}else{
	  if(val&1){
	    val= -((val+1)>>1);
	  }else{
	    val>>=1;
	  }
	}

	fit_value[i]=val+predicted;
	fit_value[look->loneighbor[i-2]]&=0x7fff;
	fit_value[look->hineighbor[i-2]]&=0x7fff;

      }else{
	fit_value[i]=predicted|0x8000;
      }
	
    }

    return(fit_value);
  }
 eop:
  return(NULL);
}